

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

int gettime(int casep)

{
  int iVar1;
  timeval timev;
  
  switch(casep) {
  case 0:
    gettimeofday((timeval *)&timev,(__timezone_ptr_t)0x0);
    iVar1 = (int)(timev.tv_usec / 1000) + (int)timev.tv_sec * 1000 + -0x5b30800;
    break;
  case 1:
    iVar1 = MiscStats->starttime;
    break;
  case 2:
    update_miscstats();
    iVar1 = MiscStats->totaltime;
    break;
  case 3:
    iVar1 = MiscStats->gctime;
    break;
  case 4:
    gettimeofday((timeval *)&timev,(__timezone_ptr_t)0x0);
    iVar1 = -0x7e36b500;
    goto LAB_0012d1aa;
  case 5:
    gettimeofday((timeval *)&timev,(__timezone_ptr_t)0x0);
    iVar1 = 0x1c94b00;
LAB_0012d1aa:
    iVar1 = iVar1 + (int)timev.tv_sec;
    break;
  case 6:
    iVar1 = 0x62;
    break;
  case 7:
    iVar1 = 0x131;
    break;
  case 8:
    tzset();
    iVar1 = (int)(_timezone / 0xe10);
    break;
  default:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int gettime(int casep)
{
#ifdef DOS
  struct dostime_t dtm; /* for hundredths of secs */
#else
  struct timeval timev;
#endif /* DOS */
  switch (casep) {
    case 0: /* elapsed time in alto milliseconds */
#ifdef DOS
      _dos_gettime(&dtm);
      return ((time(0) + UNIX_ALTO_TIME_DIFF) * 1000) + (10 * dtm.hsecond);
#else  /* DOS */
      gettimeofday(&timev, NULL);
      return ((timev.tv_sec + UNIX_ALTO_TIME_DIFF) * 1000 + timev.tv_usec / 1000);
#endif /* DOS */

    case 1: /* starting elapsed time in milliseconds */ return (MiscStats->starttime);

    case 2: /* run time, this process, in milliseconds */
      update_miscstats();
      return (MiscStats->totaltime);

    case 3: /* total GC time in milliseconds */ return (MiscStats->gctime);

    case 4: /* current time of day in Alto format */
#ifdef DOS
      return (time(0) + UNIX_ALTO_TIME_DIFF);
#else
      gettimeofday(&timev, NULL);
      return (timev.tv_sec + UNIX_ALTO_TIME_DIFF);
#endif

    case 5: /* current time of day in Interlisp format */
#ifdef DOS
      return (time(0) + LISP_UNIX_TIME_DIFF);
#else
      gettimeofday(&timev, NULL);
      return (timev.tv_sec + LISP_UNIX_TIME_DIFF);
#endif

    case 6:
      return (98); /* this is wrong, only works in PST */

    case 7:
      return (305); /* this is wrong, only works in PST */

    case 8:
      /* other methods of determining timezone offset are unreliable and/or deprecated */
      /* timezone is declared in <time.h>; the time mechanisms must be initialized     */
      /* Unfortunately, FreeBSD does not support the timezone external variable, nor   */
      /* does gettimeofday() seem to produce the correct timezone values.	       */
      tzset();
#if defined(MAIKO_OS_FREEBSD)
      time_t tv = time(NULL);
      struct tm *tm = localtime(&tv);
      return (tm->tm_gmtoff / -3600);
#else
      return (timezone / 3600); /* timezone, extern, is #secs diff GMT to local. */
#endif
    default: return (0);
  }
}